

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

float ImGui::TableGetMaxColumnWidth(ImGuiTable *table,int column_n)

{
  ImGuiTableColumn *pIVar1;
  int in_ESI;
  long in_RDI;
  float fVar2;
  float min_column_distance;
  float max_width;
  ImGuiTableColumn *column;
  float local_1c;
  
  pIVar1 = ImSpan<ImGuiTableColumn>::operator[]((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),in_ESI);
  local_1c = 3.4028235e+38;
  fVar2 = *(float *)(in_RDI + 0xc4) + *(float *)(in_RDI + 0xc4) + *(float *)(in_RDI + 0xbc) +
          *(float *)(in_RDI + 0xcc) + *(float *)(in_RDI + 0xd0);
  if ((*(uint *)(in_RDI + 4) & 0x1000000) == 0) {
    if ((*(uint *)(in_RDI + 4) & 0x40000) == 0) {
      local_1c = (-*(float *)(in_RDI + 0xc4) + -*(float *)(in_RDI + 0xc4) +
                 (((-(float)(((int)*(char *)(in_RDI + 0x1f1) - (int)pIVar1->IndexWithinEnabledSet) +
                            -1) * fVar2 + *(float *)(in_RDI + 0x118)) - pIVar1->MinX) -
                 *(float *)(in_RDI + 0xd0))) - *(float *)(in_RDI + 0xc0);
    }
  }
  else if (pIVar1->DisplayOrder < *(char *)(in_RDI + 0x203)) {
    local_1c = ((((-(float)((int)*(char *)(in_RDI + 0x203) - (int)pIVar1->DisplayOrder) * fVar2 +
                  *(float *)(in_RDI + 0x128)) - pIVar1->MinX) - *(float *)(in_RDI + 0xc0)) -
               *(float *)(in_RDI + 0xc4)) - *(float *)(in_RDI + 0xd0);
  }
  return local_1c;
}

Assistant:

float ImGui::TableGetMaxColumnWidth(const ImGuiTable* table, int column_n)
{
    const ImGuiTableColumn* column = &table->Columns[column_n];
    float max_width = FLT_MAX;
    const float min_column_distance = table->MinColumnWidth + table->CellPaddingX * 2.0f + table->CellSpacingX1 + table->CellSpacingX2;
    if (table->Flags & ImGuiTableFlags_ScrollX)
    {
        // Frozen columns can't reach beyond visible width else scrolling will naturally break.
        // (we use DisplayOrder as within a set of multiple frozen column reordering is possible)
        if (column->DisplayOrder < table->FreezeColumnsRequest)
        {
            max_width = (table->InnerClipRect.Max.x - (table->FreezeColumnsRequest - column->DisplayOrder) * min_column_distance) - column->MinX;
            max_width = max_width - table->OuterPaddingX - table->CellPaddingX - table->CellSpacingX2;
        }
    }
    else if ((table->Flags & ImGuiTableFlags_NoKeepColumnsVisible) == 0)
    {
        // If horizontal scrolling if disabled, we apply a final lossless shrinking of columns in order to make
        // sure they are all visible. Because of this we also know that all of the columns will always fit in
        // table->WorkRect and therefore in table->InnerRect (because ScrollX is off)
        // FIXME-TABLE: This is solved incorrectly but also quite a difficult problem to fix as we also want ClipRect width to match.
        // See "table_width_distrib" and "table_width_keep_visible" tests
        max_width = table->WorkRect.Max.x - (table->ColumnsEnabledCount - column->IndexWithinEnabledSet - 1) * min_column_distance - column->MinX;
        //max_width -= table->CellSpacingX1;
        max_width -= table->CellSpacingX2;
        max_width -= table->CellPaddingX * 2.0f;
        max_width -= table->OuterPaddingX;
    }
    return max_width;
}